

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O2

OptionStatus
setLocalOptionValue(HighsLogOptions *report_log_options,string *name,
                   vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records,
                   double value)

{
  OptionRecordDouble *option;
  OptionStatus OVar1;
  HighsInt index;
  double local_20;
  
  local_20 = value;
  OVar1 = getOptionIndex(report_log_options,name,option_records,&index);
  if (OVar1 == kOk) {
    option = (OptionRecordDouble *)
             (option_records->super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>).
             _M_impl.super__Vector_impl_data._M_start[index];
    if ((option->super_OptionRecord).type == kDouble) {
      OVar1 = setLocalOptionValue(report_log_options,option,local_20);
      return OVar1;
    }
    highsLogUser(report_log_options,kError,
                 "setLocalOptionValue: Option \"%s\" cannot be assigned a double\n",
                 (name->_M_dataplus)._M_p);
    OVar1 = kIllegalValue;
  }
  else {
    OVar1 = kUnknownOption;
  }
  return OVar1;
}

Assistant:

OptionStatus setLocalOptionValue(const HighsLogOptions& report_log_options,
                                 const std::string& name,
                                 std::vector<OptionRecord*>& option_records,
                                 const double value) {
  HighsInt index;
  //  printf("setLocalOptionValue: \"%s\" with double %g\n", name.c_str(),
  //  value);
  OptionStatus status =
      getOptionIndex(report_log_options, name, option_records, index);
  if (status != OptionStatus::kOk) return status;
  HighsOptionType type = option_records[index]->type;
  if (type != HighsOptionType::kDouble) {
    highsLogUser(
        report_log_options, HighsLogType::kError,
        "setLocalOptionValue: Option \"%s\" cannot be assigned a double\n",
        name.c_str());
    return OptionStatus::kIllegalValue;
  }
  return setLocalOptionValue(report_log_options,
                             ((OptionRecordDouble*)option_records[index])[0],
                             value);
}